

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_fxrem(sexp ctx,sexp a,sexp_sint_t b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sexp_uint_t sVar3;
  sexp *ppsVar4;
  ulong uVar5;
  ulong in_RDX;
  sexp in_RSI;
  sexp_luint_t n;
  int i;
  sexp_uint_t b0;
  sexp_uint_t q;
  sexp_uint_t *data;
  sexp_uint_t len;
  ulong local_60;
  long lVar6;
  sexp psVar7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar8;
  sexp local_8;
  
  sVar3 = sexp_bignum_hi(in_RSI);
  ppsVar4 = &(in_RSI->value).type.slots;
  lVar6 = 0;
  if (((long)in_RDX < 1) || ((in_RDX & in_RDX - 1) != 0)) {
    local_60 = in_RDX;
    if ((long)in_RDX < 0) {
      local_60 = -in_RDX;
    }
    if (local_60 == 0) {
      local_8 = sexp_xtype_exception
                          ((sexp)0x0,
                           (sexp)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (char *)0x0,(sexp)0x0);
    }
    else {
      iVar8 = (int)sVar3;
      while (iVar8 = iVar8 + -1, -1 < iVar8) {
        psVar7 = ppsVar4[iVar8];
        uVar5 = __udivti3(psVar7,lVar6,local_60,0);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_60;
        lVar6 = (long)psVar7 - SUB168(auVar1 * auVar2,0);
      }
      local_8 = (sexp)((in_RSI->value).flonum_bits[0] * lVar6 * 2 | 1);
    }
  }
  else {
    local_8 = (sexp)((long)(in_RSI->value).flonum_bits[0] * ((ulong)*ppsVar4 & in_RDX - 1) * 2 | 1);
  }
  return local_8;
}

Assistant:

sexp sexp_bignum_fxrem (sexp ctx, sexp a, sexp_sint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, b0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  if (b > 0) {
    q = b - 1;
    if ((b & q) == 0)
      return sexp_make_fixnum(sexp_bignum_sign(a) * (data[0] & q));
  }
  b0 = (b >= 0) ? b : -b;
  if (b0 == 0) {
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  }
  for (i=len-1; i>=0; i--) {
    n = luint_add(luint_shl(n, sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b0));
    n = luint_sub(n, luint_mul_uint(luint_from_uint(q), b0));
  }
  return sexp_make_fixnum(sexp_bignum_sign(a) * (sexp_sint_t)luint_to_uint(n));
}